

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O1

size_t __thiscall ans_byte_encode::serialize(ans_byte_encode *this,uint8_t **out_u8)

{
  ushort uVar1;
  uint uVar2;
  size_t sym;
  long lVar3;
  array<unsigned_int,_256UL> increasing_freqs;
  bit_stream local_458;
  uint local_408 [256];
  
  local_458.of = (uint32_t *)*out_u8;
  uVar1 = (this->nfreqs)._M_elems[0];
  uVar2 = (uint)uVar1;
  local_408[0] = (uint)uVar1;
  lVar3 = 1;
  do {
    uVar2 = uVar2 + 1 + (uint)(this->nfreqs)._M_elems[lVar3];
    local_408[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  local_458.first_ptr = local_458.buf;
  local_458.write_mode = true;
  local_458.last_ptr = local_458.buf + 1;
  local_458.in_word_offset = '\0';
  local_458.bytes_written = 0;
  local_458.bytes_consumed = 0;
  local_458.cur_ptr = local_458.first_ptr;
  interpolative_internal::encode_interpolative(&local_458,local_408,0x100,1,0x1101);
  if ((local_458.write_mode == true) && (local_458.in_word_offset != '\0')) {
    *local_458.of = *local_458.first_ptr;
    local_458.bytes_written = local_458.bytes_written + 4;
    local_458.in_word_offset = '\0';
    local_458.of = local_458.of + 1;
  }
  if ((local_458.write_mode != false) && (local_458.in_word_offset != '\0')) {
    *local_458.of = *local_458.first_ptr;
  }
  *out_u8 = *out_u8 + local_458.bytes_written;
  return local_458.bytes_written;
}

Assistant:

size_t serialize(uint8_t*& out_u8)
    {
        auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
        std::array<uint32_t, constants::MAX_SIGMA> increasing_freqs;
        increasing_freqs[0] = nfreqs[0];
        for (size_t sym = 1; sym < constants::MAX_SIGMA; sym++) {
            increasing_freqs[sym] = increasing_freqs[sym - 1] + nfreqs[sym] + 1;
        }
        auto in_buf = increasing_freqs.data();
        auto bytes_written = interpolative_internal::encode(out_ptr_u32, in_buf,
            constants::MAX_SIGMA,
            constants::MAX_FRAME_SIZE + constants::MAX_SIGMA);

        out_u8 += bytes_written;
        return bytes_written;
    }